

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O3

c_v64 simd_test_sse4_1::c_imm_v64_shr_n_s8<7>(c_v64 a)

{
  c_v64 cVar1;
  
  cVar1._0_1_ = -(a.s8[0] < '\0');
  cVar1._1_1_ = -(a.s8[1] < '\0');
  cVar1._2_1_ = -(a.s8[2] < '\0');
  cVar1._3_1_ = -(a.s8[3] < '\0');
  cVar1._4_1_ = -(a.s8[4] < '\0');
  cVar1._5_1_ = -(a.s8[5] < '\0');
  cVar1._6_1_ = -(a.s8[6] < '\0');
  cVar1._7_1_ = -(a.s64 < 0);
  return (c_v64)cVar1.u64;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shr_s8(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 7) {
    fprintf(stderr, "Error: Undefined s8 shift right %d\n", n);
    abort();
  }
  for (c = 0; c < 8; c++) t.s8[c] = a.s8[c] >> n;
  return t;
}